

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

TableOfContentsNode * __thiscall
soul::findOrCreateNode
          (soul *this,TableOfContentsNode *node,
          ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  int iVar3;
  TableOfContentsNode *pTVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pTVar6;
  ArrayView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  path_00;
  TableOfContentsNode local_78;
  
  pbVar5 = path.e;
  path_00.s = (TableOfContentsNode *)path.s;
  pTVar4 = (TableOfContentsNode *)this;
  if (node != path_00.s) {
    do {
      if (((long)path_00.s - (long)node == 0x20) &&
         (sVar2 = (node->name)._M_string_length, sVar2 == (pTVar4->name)._M_string_length)) {
        if (sVar2 == 0) {
          return pTVar4;
        }
        iVar3 = bcmp((node->name)._M_dataplus._M_p,(pTVar4->name)._M_dataplus._M_p,sVar2);
        if (iVar3 == 0) {
          return pTVar4;
        }
      }
      this = (soul *)(pTVar4->children).
                     super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = (pTVar4->children).
               super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((pointer)this == pTVar6) {
LAB_001b8bd7:
        paVar1 = &local_78.name.field_2;
        local_78.name._M_string_length = 0;
        local_78.name.field_2._M_local_buf[0] = '\0';
        local_78.children.
        super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.children.
        super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.children.
        super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78.module = (Module *)0x0;
        local_78.file = (File *)0x0;
        local_78.name._M_dataplus._M_p = (pointer)paVar1;
        std::
        vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
        ::emplace_back<soul::SourceCodeModel::TableOfContentsNode>(&pTVar4->children,&local_78);
        std::
        vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
        ::~vector(&local_78.children);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_78.name._M_dataplus._M_p,
                          CONCAT71(local_78.name.field_2._M_allocated_capacity._1_7_,
                                   local_78.name.field_2._M_local_buf[0]) + 1);
        }
        pTVar6 = (pTVar4->children).
                 super__Vector_base<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::__cxx11::string::_M_assign((string *)pTVar6);
        if ((ulong)((long)path_00.s - (long)node) < 0x21) {
          return pTVar6;
        }
        path_00.e = pbVar5;
        pTVar4 = findOrCreateNode((soul *)pTVar6,(TableOfContentsNode *)&node->children,path_00);
        return pTVar4;
      }
      sVar2 = (node->name)._M_string_length;
      while ((sVar2 != (((TableOfContentsNode *)this)->name)._M_string_length ||
             ((sVar2 != 0 &&
              (iVar3 = bcmp((node->name)._M_dataplus._M_p,
                            (((TableOfContentsNode *)this)->name)._M_dataplus._M_p,sVar2),
              iVar3 != 0))))) {
        this = (soul *)((long)this + 0x48);
        if ((pointer)this == pTVar6) goto LAB_001b8bd7;
      }
      node = (TableOfContentsNode *)&node->children;
      pTVar4 = (TableOfContentsNode *)this;
    } while (node != path_00.s);
  }
  return (TableOfContentsNode *)this;
}

Assistant:

static SourceCodeModel::TableOfContentsNode& findOrCreateNode (SourceCodeModel::TableOfContentsNode& node,
                                                               ArrayView<std::string> path)
{
    if (path.empty())
        return node;

    auto& firstPart = path.front();

    if (path.size() == 1 && firstPart == node.name)
        return node;

    for (auto& c : node.children)
        if (firstPart == c.name)
            return findOrCreateNode (c, path.tail());

    node.children.push_back ({});
    auto& n = node.children.back();
    n.name = firstPart;
    return path.size() > 1 ? findOrCreateNode (n, path.tail()) : n;
}